

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBControlTransfers.cpp
# Opt level: O1

U32 __thiscall USBPacket::GetDataPayload(USBPacket *this,int offset,int bcnt)

{
  pointer puVar1;
  
  switch(bcnt) {
  case 1:
    return (U32)(this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start[(long)offset + 2];
  case 2:
    return (U32)*(ushort *)
                 ((this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start + (long)offset + 2);
  case 3:
    puVar1 = (this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    return (uint)puVar1[(long)offset + 2] |
           (uint)puVar1[(long)offset + 3] << 8 | (uint)puVar1[(long)offset + 4] << 0x10;
  case 4:
    return *(U32 *)((this->mData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + (long)offset + 2);
  default:
    return 0;
  }
}

Assistant:

U32 USBPacket::GetDataPayload( int offset, int bcnt ) const
{
    U32 ret_val = 0;

    if( bcnt == 1 )
        ret_val = mData[ offset + 2 ];
    else if( bcnt == 2 )
        ret_val = ( mData[ offset + 3 ] << 8 ) | mData[ offset + 2 ];
    else if( bcnt == 3 )
        ret_val = ( mData[ offset + 4 ] << 16 ) | ( mData[ offset + 3 ] << 8 ) | mData[ offset + 2 ];
    else if( bcnt == 4 )
        ret_val = ( mData[ offset + 5 ] << 24 ) | ( mData[ offset + 4 ] << 16 ) | ( mData[ offset + 3 ] << 8 ) | mData[ offset + 2 ];

    return ret_val;
}